

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::bt_peer_connection::write_pe_vc_cryptofield
          (bt_peer_connection *this,span<char> write_buf,int crypto_field,int pad_size)

{
  byte bVar1;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  unsigned_short val;
  char *pcVar9;
  span<char> buffer;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  
  buffer.m_len = write_buf.m_len;
  pcVar9 = write_buf.m_ptr;
  uVar6 = (ushort)((crypto_field & 0xff00ffU) >> 0x10);
  uVar7 = (ushort)((uint)crypto_field >> 8) & 0xff;
  uVar8 = (ushort)(crypto_field & 0xff00ffU);
  pcVar9[0] = '\0';
  pcVar9[1] = '\0';
  pcVar9[2] = '\0';
  pcVar9[3] = '\0';
  pcVar9[4] = '\0';
  pcVar9[5] = '\0';
  pcVar9[6] = '\0';
  pcVar9[7] = '\0';
  bVar1 = (byte)((uint)crypto_field >> 0x18);
  uVar5 = (ushort)bVar1;
  bVar1 = (uVar5 != 0) * (uVar5 < 0x100) * bVar1 - (0xff < uVar5);
  bVar2 = ((crypto_field & 0xff0000U) != 0) * (uVar6 < 0x100) * (char)((uint)crypto_field >> 0x10) -
          (0xff < uVar6);
  bVar3 = ((crypto_field & 0xff00U) != 0) * (uVar7 < 0x100) * (char)((uint)crypto_field >> 8) -
          (0xff < uVar7);
  bVar4 = ((crypto_field & 0xffU) != 0) * (uVar8 < 0x100) * (char)crypto_field - (0xff < uVar8);
  *(uint *)(pcVar9 + 8) =
       CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                CONCAT12((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                         CONCAT11((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),
                                  (bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1))));
  pcVar9[0xc] = (char)((uint)pad_size >> 8);
  pcVar9[0xd] = (char)pad_size;
  buffer.m_ptr = (char *)(long)pad_size;
  random_bytes((aux *)(pcVar9 + 0xe),buffer);
  if (((this->super_peer_connection).field_0x885 & 8) != 0) {
    *(undefined2 *)((aux *)(pcVar9 + 0xe) + pad_size) = 0x4400;
  }
  return;
}

Assistant:

void bt_peer_connection::write_pe_vc_cryptofield(
		span<char> write_buf
		, int const crypto_field
		, int const pad_size)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(crypto_field <= 0x03 && crypto_field > 0);
		// vc,crypto_field,len(pad),pad, (len(ia))
		TORRENT_ASSERT((write_buf.size() >= 8+4+2+pad_size+2
				&& is_outgoing())
			|| (write_buf.size() >= 8+4+2+pad_size && !is_outgoing()));
		TORRENT_ASSERT(!m_sent_handshake);

		// encrypt(vc, crypto_provide/select, len(Pad), len(IA))
		// len(pad) is zero for now, len(IA) only for outgoing connections

		// vc
		std::memset(write_buf.data(), 0, 8);
		write_buf = write_buf.subspan(8);

		aux::write_uint32(crypto_field, write_buf);
		aux::write_uint16(pad_size, write_buf); // len (pad)

		aux::random_bytes(write_buf.first(pad_size));
		write_buf = write_buf.subspan(pad_size);

		// append len(ia) if we are initiating
		if (is_outgoing())
			aux::write_uint16(handshake_len, write_buf); // len(IA)
	}